

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_str_delete_runes(nk_str *s,int pos,int len)

{
  void *pvVar1;
  char *pcVar2;
  char *pcVar3;
  int unused;
  nk_rune unicode;
  int iStack_28;
  nk_rune local_24;
  
  if (s == (nk_str *)0x0) {
    __assert_fail("s",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x1bb5,"void nk_str_delete_runes(struct nk_str *, int, int)");
  }
  if (len + pos <= s->len) {
    if (len != 0) {
      pvVar1 = (s->buffer).memory.ptr;
      pcVar2 = nk_str_at_rune(s,pos,&local_24,&iStack_28);
      if (pcVar2 != (char *)0x0) {
        (s->buffer).memory.ptr = pcVar2;
        pcVar3 = nk_str_at_rune(s,len,&local_24,&iStack_28);
        (s->buffer).memory.ptr = pvVar1;
        if (pcVar3 != (char *)0x0) {
          nk_str_delete_chars(s,(int)pcVar2 - (int)pvVar1,(int)pcVar3 - (int)pcVar2);
        }
      }
    }
    return;
  }
  __assert_fail("s->len >= pos + len",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x1bb6,"void nk_str_delete_runes(struct nk_str *, int, int)");
}

Assistant:

NK_API void
nk_str_delete_runes(struct nk_str *s, int pos, int len)
{
    char *temp;
    nk_rune unicode;
    char *begin;
    char *end;
    int unused;

    NK_ASSERT(s);
    NK_ASSERT(s->len >= pos + len);
    if (s->len < pos + len)
        len = NK_CLAMP(0, (s->len - pos), s->len);
    if (!len) return;

    temp = (char *)s->buffer.memory.ptr;
    begin = nk_str_at_rune(s, pos, &unicode, &unused);
    if (!begin) return;
    s->buffer.memory.ptr = begin;
    end = nk_str_at_rune(s, len, &unicode, &unused);
    s->buffer.memory.ptr = temp;
    if (!end) return;
    nk_str_delete_chars(s, (int)(begin - temp), (int)(end - begin));
}